

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_4_4_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int i;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  float *pfVar34;
  long lVar35;
  float *pfVar36;
  float *pfVar37;
  long lVar38;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [12];
  undefined1 auVar74 [64];
  float fVar76;
  undefined1 in_ZMM8 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [64];
  
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  fVar53 = ipoint->scale;
  auVar80 = ZEXT464((uint)fVar53);
  auVar44 = ZEXT816(0x3fe0000000000000);
  auVar74 = ZEXT1664(auVar44);
  auVar49 = ZEXT416((uint)fVar53);
  auVar40 = vpternlogd_avx512vl(auVar48,auVar49,auVar47,0xf8);
  auVar40 = ZEXT416((uint)(fVar53 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  fVar52 = -0.08 / (fVar53 * fVar53);
  iVar25 = (int)auVar40._0_4_;
  auVar41._0_4_ = (int)auVar40._0_4_;
  auVar41._4_4_ = (int)auVar40._4_4_;
  auVar41._8_4_ = (int)auVar40._8_4_;
  auVar41._12_4_ = (int)auVar40._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar41);
  auVar41 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)ipoint->x),auVar47,0xf8);
  auVar41 = ZEXT416((uint)(ipoint->x + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42._0_8_ = (double)auVar41._0_4_;
  auVar42._8_8_ = auVar41._8_8_;
  auVar46._0_8_ = (double)fVar53;
  auVar46._8_8_ = 0;
  auVar41 = vfmadd231sd_fma(auVar42,auVar46,auVar44);
  auVar45._0_4_ = (float)auVar41._0_8_;
  auVar45._4_12_ = auVar41._4_12_;
  auVar41 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)ipoint->y),auVar47,0xf8);
  fVar3 = auVar45._0_4_ - auVar40._0_4_;
  auVar41 = ZEXT416((uint)(ipoint->y + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar43._0_8_ = (double)auVar41._0_4_;
  auVar43._8_8_ = auVar41._8_8_;
  auVar41 = vfmadd231sd_fma(auVar43,auVar46,auVar44);
  auVar44._0_4_ = (float)auVar41._0_8_;
  auVar44._4_12_ = auVar41._4_12_;
  fVar79 = auVar44._0_4_ - auVar40._0_4_;
  auVar42 = ZEXT416((uint)fVar53);
  auVar40 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar42,auVar45);
  auVar41 = vpternlogd_avx512vl(auVar48,auVar40,auVar47,0xf8);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  if (iVar25 < (int)auVar40._0_4_) {
    auVar50._8_4_ = 0x3effffff;
    auVar50._0_8_ = 0x3effffff3effffff;
    auVar50._12_4_ = 0x3effffff;
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar40 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar42,auVar44);
    auVar41 = vpternlogd_avx512vl(auVar51,auVar40,auVar50,0xea);
    auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
    auVar40 = vroundss_avx(auVar40,auVar40,0xb);
    if (iVar25 < (int)auVar40._0_4_) {
      auVar40 = vfmadd231ss_fma(auVar45,auVar42,ZEXT416(0x41300000));
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar41 = vpternlogd_avx512vl(auVar70,auVar40,auVar50,0xea);
      auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
      auVar40 = vroundss_avx(auVar40,auVar40,0xb);
      if ((int)auVar40._0_4_ + iVar25 <= iimage->width) {
        auVar40 = vfmadd231ss_fma(auVar44,auVar42,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar41 = vpternlogd_avx512vl(auVar50,auVar40,auVar13,0xf8);
        auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
        auVar40 = vroundss_avx(auVar40,auVar40,0xb);
        if ((int)auVar40._0_4_ + iVar25 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          fVar79 = fVar79 + 0.5;
          lVar38 = 300;
          for (uVar29 = 0xfffffff4; (int)uVar29 < 0xc; uVar29 = uVar29 + 4) {
            auVar40._0_4_ = (float)(int)uVar29;
            auVar75 = in_ZMM8._4_12_;
            auVar40._4_12_ = auVar75;
            auVar41 = auVar80._0_16_;
            auVar40 = vfmadd213ss_fma(auVar40,auVar41,ZEXT416((uint)fVar79));
            iVar18 = (int)auVar40._0_4_;
            auVar56._0_4_ = (float)(int)(uVar29 | 1);
            auVar56._4_12_ = auVar75;
            auVar40 = vfmadd213ss_fma(auVar56,auVar41,ZEXT416((uint)fVar79));
            iVar17 = (int)auVar40._0_4_;
            auVar57._0_4_ = (float)(int)(uVar29 | 2);
            auVar57._4_12_ = auVar75;
            auVar40 = vfmadd213ss_fma(auVar57,auVar41,ZEXT416((uint)fVar79));
            iVar16 = (int)auVar40._0_4_;
            auVar58._0_4_ = (float)(int)(uVar29 | 3);
            auVar58._4_12_ = auVar75;
            auVar40 = vfmadd213ss_fma(auVar58,auVar41,ZEXT416((uint)fVar79));
            iVar15 = (int)auVar40._0_4_;
            lVar39 = lVar38;
            for (iVar22 = -0xc; iVar22 < 0xc; iVar22 = iVar22 + 4) {
              auVar59._0_4_ = (float)iVar22;
              auVar59._4_12_ = in_ZMM8._4_12_;
              auVar40 = vfmadd213ss_fma(auVar59,auVar49,ZEXT416((uint)fVar3));
              iVar26 = (int)auVar40._0_4_;
              auVar60._0_4_ = (float)(iVar22 + 1);
              auVar75 = auVar74._4_12_;
              auVar60._4_12_ = auVar75;
              auVar40 = vfmadd213ss_fma(auVar60,auVar49,ZEXT416((uint)fVar3));
              iVar19 = (int)auVar40._0_4_;
              auVar61._0_4_ = (float)(iVar22 + 2);
              auVar61._4_12_ = auVar75;
              auVar40 = vfmadd213ss_fma(auVar61,auVar49,ZEXT416((uint)fVar3));
              iVar20 = (int)auVar40._0_4_;
              auVar62._0_4_ = (float)(iVar22 + 3);
              auVar62._4_12_ = auVar75;
              auVar40 = vfmadd213ss_fma(auVar62,auVar49,ZEXT416((uint)fVar3));
              iVar21 = (int)auVar40._0_4_;
              haarXY_unconditional
                        (iimage,iVar18,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -300),
                         (float *)((long)haarResponseY + lVar39 + -300));
              haarXY_unconditional
                        (iimage,iVar17,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -0xcc)
                         ,(float *)((long)haarResponseY + lVar39 + -0xcc));
              haarXY_unconditional
                        (iimage,iVar16,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -0x6c)
                         ,(float *)((long)haarResponseY + lVar39 + -0x6c));
              haarXY_unconditional
                        (iimage,iVar15,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -0xc),
                         (float *)((long)haarResponseY + lVar39 + -0xc));
              haarXY_unconditional
                        (iimage,iVar18,iVar19,iVar25,
                         (float *)((long)haarResponseX + lVar39 + -0x128),
                         (float *)((long)haarResponseY + lVar39 + -0x128));
              haarXY_unconditional
                        (iimage,iVar17,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -200),
                         (float *)((long)haarResponseY + lVar39 + -200));
              haarXY_unconditional
                        (iimage,iVar16,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -0x68)
                         ,(float *)((long)haarResponseY + lVar39 + -0x68));
              haarXY_unconditional
                        (iimage,iVar15,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -8),
                         (float *)((long)haarResponseY + lVar39 + -8));
              haarXY_unconditional
                        (iimage,iVar18,iVar20,iVar25,
                         (float *)((long)haarResponseX + lVar39 + -0x124),
                         (float *)((long)haarResponseY + lVar39 + -0x124));
              haarXY_unconditional
                        (iimage,iVar17,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -0xc4)
                         ,(float *)((long)haarResponseY + lVar39 + -0xc4));
              haarXY_unconditional
                        (iimage,iVar16,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -100),
                         (float *)((long)haarResponseY + lVar39 + -100));
              haarXY_unconditional
                        (iimage,iVar15,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -4),
                         (float *)((long)haarResponseY + lVar39 + -4));
              haarXY_unconditional
                        (iimage,iVar18,iVar21,iVar25,
                         (float *)((long)haarResponseX + lVar39 + -0x120),
                         (float *)((long)haarResponseY + lVar39 + -0x120));
              haarXY_unconditional
                        (iimage,iVar17,iVar21,iVar25,(float *)((long)haarResponseX + lVar39 + -0xc0)
                         ,(float *)((long)haarResponseY + lVar39 + -0xc0));
              haarXY_unconditional
                        (iimage,iVar16,iVar21,iVar25,(float *)((long)haarResponseX + lVar39 + -0x60)
                         ,(float *)((long)haarResponseY + lVar39 + -0x60));
              haarXY_unconditional
                        (iimage,iVar15,iVar21,iVar25,(float *)((long)haarResponseX + lVar39),
                         (float *)((long)haarResponseY + lVar39));
              lVar39 = lVar39 + 0x10;
            }
            auVar80 = ZEXT1664(auVar49);
            lVar38 = lVar38 + 0x180;
          }
          goto LAB_00191145;
        }
      }
    }
  }
  lVar38 = 300;
  for (uVar29 = 0xfffffff4; (int)uVar29 < 0xc; uVar29 = uVar29 + 4) {
    auVar54._0_4_ = (float)(int)uVar29;
    auVar75 = in_ZMM8._4_12_;
    auVar54._4_12_ = auVar75;
    auVar42 = auVar80._0_16_;
    auVar40 = vfmadd213ss_fma(auVar54,auVar42,ZEXT416((uint)fVar79));
    auVar64._0_4_ = (float)(int)(uVar29 | 1);
    auVar64._4_12_ = auVar75;
    fVar53 = auVar40._0_4_;
    auVar68._0_4_ = (float)(int)(uVar29 | 2);
    auVar68._4_12_ = auVar75;
    auVar71._0_4_ = (float)(int)(uVar29 | 3);
    auVar71._4_12_ = auVar75;
    auVar40 = vfmadd213ss_fma(auVar64,auVar42,ZEXT416((uint)fVar79));
    auVar41 = vfmadd213ss_fma(auVar68,auVar42,ZEXT416((uint)fVar79));
    auVar42 = vfmadd213ss_fma(auVar71,auVar42,ZEXT416((uint)fVar79));
    fVar63 = auVar40._0_4_;
    iVar15 = (int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53);
    fVar53 = auVar41._0_4_;
    iVar16 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    fVar63 = auVar42._0_4_;
    iVar17 = (int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53);
    iVar18 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    lVar39 = lVar38;
    for (iVar22 = -0xc; iVar22 < 0xc; iVar22 = iVar22 + 4) {
      auVar55._0_4_ = (float)iVar22;
      auVar75 = in_ZMM8._4_12_;
      auVar55._4_12_ = auVar75;
      auVar40 = vfmadd213ss_fma(auVar55,auVar49,ZEXT416((uint)fVar3));
      auVar65._0_4_ = (float)(iVar22 + 1);
      auVar65._4_12_ = auVar75;
      auVar41 = vfmadd213ss_fma(auVar65,auVar49,ZEXT416((uint)fVar3));
      auVar69._0_4_ = (float)(iVar22 + 2);
      auVar69._4_12_ = auVar75;
      auVar42 = vfmadd213ss_fma(auVar69,auVar49,ZEXT416((uint)fVar3));
      auVar72._0_4_ = (float)(iVar22 + 3);
      auVar72._4_12_ = auVar75;
      auVar43 = vfmadd213ss_fma(auVar72,auVar49,ZEXT416((uint)fVar3));
      fVar53 = auVar40._0_4_;
      fVar63 = auVar41._0_4_;
      fVar66 = auVar42._0_4_;
      iVar26 = (int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53);
      iVar19 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      fVar53 = auVar43._0_4_;
      iVar20 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      iVar21 = (int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53);
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -300),
                 (float *)((long)haarResponseY + lVar39 + -300));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -0xcc),
                 (float *)((long)haarResponseY + lVar39 + -0xcc));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -0x6c),
                 (float *)((long)haarResponseY + lVar39 + -0x6c));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar26,iVar25,(float *)((long)haarResponseX + lVar39 + -0xc),
                 (float *)((long)haarResponseY + lVar39 + -0xc));
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -0x128),
                 (float *)((long)haarResponseY + lVar39 + -0x128));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -200),
                 (float *)((long)haarResponseY + lVar39 + -200));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -0x68),
                 (float *)((long)haarResponseY + lVar39 + -0x68));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar19,iVar25,(float *)((long)haarResponseX + lVar39 + -8),
                 (float *)((long)haarResponseY + lVar39 + -8));
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -0x124),
                 (float *)((long)haarResponseY + lVar39 + -0x124));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -0xc4),
                 (float *)((long)haarResponseY + lVar39 + -0xc4));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -100),
                 (float *)((long)haarResponseY + lVar39 + -100));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar20,iVar25,(float *)((long)haarResponseX + lVar39 + -4),
                 (float *)((long)haarResponseY + lVar39 + -4));
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar21,iVar25,(float *)((long)haarResponseX + lVar39 + -0x120),
                 (float *)((long)haarResponseY + lVar39 + -0x120));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar21,iVar25,(float *)((long)haarResponseX + lVar39 + -0xc0),
                 (float *)((long)haarResponseY + lVar39 + -0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar21,iVar25,(float *)((long)haarResponseX + lVar39 + -0x60),
                 (float *)((long)haarResponseY + lVar39 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar21,iVar25,(float *)((long)haarResponseX + lVar39),
                 (float *)((long)haarResponseY + lVar39));
      lVar39 = lVar39 + 0x10;
    }
    auVar80 = ZEXT1664(auVar49);
    lVar38 = lVar38 + 0x180;
  }
LAB_00191145:
  fVar79 = auVar80._0_4_;
  auVar78._8_4_ = 0x3effffff;
  auVar78._0_8_ = 0x3effffff3effffff;
  auVar78._12_4_ = 0x3effffff;
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar40 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 0.5)),auVar77,0xf8);
  auVar40 = ZEXT416((uint)(fVar79 * 0.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 1.5)),auVar77,0xf8);
  auVar41 = ZEXT416((uint)(fVar79 * 1.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 2.5)),auVar77,0xf8);
  auVar42 = ZEXT416((uint)(fVar79 * 2.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 3.5)),auVar77,0xf8);
  auVar43 = ZEXT416((uint)(fVar79 * 3.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 4.5)),auVar77,0xf8);
  auVar44 = ZEXT416((uint)(fVar79 * 4.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 5.5)),auVar77,0xf8);
  auVar45 = ZEXT416((uint)(fVar79 * 5.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 6.5)),auVar77,0xf8);
  auVar46 = ZEXT416((uint)(fVar79 * 6.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 7.5)),auVar77,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + fVar79 * 7.5));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 8.5)),auVar77,0xf8);
  auVar48 = ZEXT416((uint)(fVar79 * 8.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 9.5)),auVar77,0xf8);
  auVar49 = ZEXT416((uint)(fVar79 * 9.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 10.5)),auVar77,0xf8);
  auVar50 = ZEXT416((uint)(fVar79 * 10.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar79 * 11.5)),auVar77,0xf8);
  fVar67 = auVar42._0_4_;
  fVar53 = fVar67 + auVar41._0_4_;
  fVar3 = fVar67 + auVar40._0_4_;
  auVar42 = ZEXT416((uint)(fVar79 * 11.5 + auVar51._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  fVar79 = fVar67 - auVar40._0_4_;
  fVar63 = fVar67 - auVar41._0_4_;
  fVar66 = fVar67 - auVar43._0_4_;
  fVar4 = fVar67 - auVar44._0_4_;
  fVar5 = fVar67 - auVar45._0_4_;
  fVar67 = fVar67 - auVar46._0_4_;
  fVar76 = auVar47._0_4_;
  fVar6 = fVar76 - auVar43._0_4_;
  fVar7 = fVar76 - auVar44._0_4_;
  fVar8 = fVar76 - auVar45._0_4_;
  fVar9 = fVar76 - auVar46._0_4_;
  fVar10 = fVar76 - auVar48._0_4_;
  fVar11 = fVar76 - auVar49._0_4_;
  fVar12 = fVar76 - auVar50._0_4_;
  fVar76 = fVar76 - auVar42._0_4_;
  gauss_s1_c0[0] = expf(fVar53 * fVar53 * fVar52);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar52);
  gauss_s1_c0[2] = expf(fVar79 * fVar79 * fVar52);
  gauss_s1_c0[3] = expf(fVar63 * fVar63 * fVar52);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar66 * fVar66 * fVar52);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar52);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar52);
  gauss_s1_c0[8] = expf(fVar67 * fVar67 * fVar52);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar52);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar52);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar52);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar52);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar52);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar52);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar52);
  gauss_s1_c1[8] = expf(fVar76 * fVar76 * fVar52);
  auVar74 = ZEXT1264(ZEXT812(0));
  lVar38 = 0;
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  iVar25 = 0;
  lVar39 = 0;
  uVar24 = 0xfffffffffffffff8;
  while (uVar29 = (uint)uVar24, (int)uVar29 < 8) {
    pfVar36 = gauss_s1_c1;
    if (uVar29 != 7) {
      pfVar36 = gauss_s1_c0;
    }
    lVar35 = (long)iVar25;
    lVar39 = (long)(int)lVar39;
    iVar25 = iVar25 + 4;
    if (uVar29 == 0xfffffff8) {
      pfVar36 = gauss_s1_c1;
    }
    uVar27 = 0;
    uVar33 = 0xfffffffffffffff8;
    lVar28 = lVar38;
    while (lVar35 != iVar25) {
      pfVar37 = gauss_s1_c1;
      iVar22 = (int)uVar33;
      if (iVar22 != 7) {
        pfVar37 = gauss_s1_c0;
      }
      auVar80 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar33 = (ulong)((uint)(uVar33 >> 0x1c) & 8);
      if (iVar22 == -8) {
        pfVar37 = gauss_s1_c1;
      }
      lVar30 = (long)haarResponseX + lVar28;
      lVar31 = (long)haarResponseY + lVar28;
      for (uVar23 = uVar27; uVar23 < iVar22 * 0x18 + 0x198; uVar23 = uVar23 + 0x18) {
        lVar32 = 0;
        pfVar34 = (float *)((long)pfVar36 + (ulong)(((uint)(uVar24 >> 0x1f) & 1) << 5));
        while (lVar32 != 9) {
          fVar53 = *pfVar34;
          pfVar34 = pfVar34 + (ulong)(~uVar29 >> 0x1f) * 2 + -1;
          lVar1 = lVar32 * 4;
          lVar2 = lVar32 * 4;
          lVar32 = lVar32 + 1;
          auVar42 = ZEXT416((uint)(pfVar37[uVar33] * fVar53 * *(float *)(lVar30 + lVar2)));
          auVar40 = vandps_avx(auVar42,auVar49);
          auVar43 = ZEXT416((uint)(pfVar37[uVar33] * fVar53 * *(float *)(lVar31 + lVar1)));
          auVar41 = vandps_avx(auVar43,auVar49);
          auVar42 = vinsertps_avx(auVar43,auVar42,0x10);
          auVar41 = vmovlhps_avx(auVar42,auVar41);
          auVar40 = vinsertps_avx(auVar41,auVar40,0x30);
          auVar80 = ZEXT1664(CONCAT412(auVar80._12_4_ + auVar40._12_4_,
                                       CONCAT48(auVar80._8_4_ + auVar40._8_4_,
                                                CONCAT44(auVar80._4_4_ + auVar40._4_4_,
                                                         auVar80._0_4_ + auVar40._0_4_))));
        }
        uVar33 = uVar33 + (ulong)(-1 < iVar22) * 2 + -1;
        lVar30 = lVar30 + 0x60;
        lVar31 = lVar31 + 0x60;
      }
      uVar33 = (ulong)(iVar22 + 5);
      uVar27 = uVar27 + 0x78;
      lVar28 = lVar28 + 0x1e0;
      fVar53 = gauss_s2_arr[lVar35];
      auVar14._4_4_ = fVar53;
      auVar14._0_4_ = fVar53;
      auVar14._8_4_ = fVar53;
      auVar14._12_4_ = fVar53;
      auVar43 = vmulps_avx512vl(auVar80._0_16_,auVar14);
      lVar35 = lVar35 + 1;
      auVar73._0_4_ = auVar43._0_4_ * auVar43._0_4_;
      auVar73._4_4_ = auVar43._4_4_ * auVar43._4_4_;
      auVar73._8_4_ = auVar43._8_4_ * auVar43._8_4_;
      auVar73._12_4_ = auVar43._12_4_ * auVar43._12_4_;
      auVar41 = vshufpd_avx(auVar43,auVar43,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar39) = auVar43;
      lVar39 = lVar39 + 4;
      auVar40 = vmovshdup_avx(auVar73);
      auVar42 = vfmadd231ss_fma(auVar40,auVar43,auVar43);
      auVar40 = vshufps_avx(auVar43,auVar43,0xff);
      auVar41 = vfmadd213ss_fma(auVar41,auVar41,auVar42);
      auVar40 = vfmadd213ss_fma(auVar40,auVar40,auVar41);
      auVar74 = ZEXT464((uint)(auVar74._0_4_ + auVar40._0_4_));
    }
    lVar38 = lVar38 + 0x14;
    uVar24 = (ulong)(uVar29 + 5);
  }
  if (auVar74._0_4_ < 0.0) {
    fVar53 = sqrtf(auVar74._0_4_);
  }
  else {
    auVar40 = vsqrtss_avx(auVar74._0_16_,auVar74._0_16_);
    fVar53 = auVar40._0_4_;
  }
  for (lVar38 = 0; lVar38 != 0x40; lVar38 = lVar38 + 1) {
    ipoint->descriptor[lVar38] = (1.0 / fVar53) * ipoint->descriptor[lVar38];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}